

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_psx_Mutex.cpp
# Opt level: O2

bool __thiscall axl::sys::psx::MutexAttr::getType(MutexAttr *this,int *value)

{
  uint_t code;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> BStack_28;
  
  code = pthread_mutexattr_gettype((pthread_mutexattr_t *)this,value);
  if (code != 0) {
    err::ErrorRef::ErrorRef((ErrorRef *)&BStack_28,code);
    err::setError((ErrorRef *)&BStack_28);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef(&BStack_28);
  }
  return code == 0;
}

Assistant:

bool
MutexAttr::getType(int* value) const {
	int result = ::pthread_mutexattr_gettype(&m_attr, value);
	return result == 0 ? true : err::fail(result);
}